

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData *
cfd::core::CryptoUtil::ConvertSignatureToDer
          (ByteData *__return_storage_ptr__,string *hex_string,SigHashType *sighash_type)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::ByteData((ByteData *)&local_30,(string *)hex_string);
  ConvertSignatureToDer(__return_storage_ptr__,(ByteData *)&local_30,sighash_type);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData CryptoUtil::ConvertSignatureToDer(
    const std::string &hex_string, const SigHashType &sighash_type) {
  return ConvertSignatureToDer(ByteData(hex_string), sighash_type);
}